

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assign.h
# Opt level: O0

void Eigen::internal::
     assign_impl<Eigen::SelfCwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_-1,_-1,_false>,_-1,_-1,_false>,_Eigen::CoeffBasedProduct<Eigen::Matrix<double,_-1,_1,_0,_2,_1>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,_-1,_1,_false>_>,_256>_>,_Eigen::CoeffBasedProduct<Eigen::Matrix<double,_-1,_1,_0,_2,_1>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,_-1,_1,_false>_>,_256>,_0,_0,_0>
     ::run(SelfCwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,__1,_false>,_Eigen::CoeffBasedProduct<Eigen::Matrix<double,__1,_1,_0,_2,_1>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false>_>,_256>_>
           *dst,CoeffBasedProduct<Eigen::Matrix<double,__1,_1,_0,_2,_1>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false>_>,_256>
                *src)

{
  Index outer_00;
  Index inner_00;
  DenseCoeffsBase<Eigen::SelfCwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,__1,_false>,_Eigen::CoeffBasedProduct<Eigen::Matrix<double,__1,_1,_0,_2,_1>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false>_>,_256>_>,_1>
  *in_RSI;
  Index inner;
  Index outer;
  Index outerSize;
  Index innerSize;
  long local_30;
  DenseBase<Eigen::CoeffBasedProduct<Eigen::Matrix<double,__1,_1,_0,_2,_1>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false>_>,_256>_>
  *other;
  
  outer_00 = DenseBase<Eigen::SelfCwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_-1,_-1,_false>,_-1,_-1,_false>,_Eigen::CoeffBasedProduct<Eigen::Matrix<double,_-1,_1,_0,_2,_1>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,_-1,_1,_false>_>,_256>_>_>
             ::innerSize((DenseBase<Eigen::SelfCwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,__1,_false>,_Eigen::CoeffBasedProduct<Eigen::Matrix<double,__1,_1,_0,_2,_1>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false>_>,_256>_>_>
                          *)0x2fe368);
  inner_00 = DenseBase<Eigen::SelfCwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_-1,_-1,_false>,_-1,_-1,_false>,_Eigen::CoeffBasedProduct<Eigen::Matrix<double,_-1,_1,_0,_2,_1>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,_-1,_1,_false>_>,_256>_>_>
             ::outerSize((DenseBase<Eigen::SelfCwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,__1,_false>,_Eigen::CoeffBasedProduct<Eigen::Matrix<double,__1,_1,_0,_2,_1>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false>_>,_256>_>_>
                          *)0x2fe377);
  for (other = (DenseBase<Eigen::CoeffBasedProduct<Eigen::Matrix<double,__1,_1,_0,_2,_1>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false>_>,_256>_>
                *)0x0; (long)other < inner_00; other = other + 1) {
    for (local_30 = 0; local_30 < outer_00; local_30 = local_30 + 1) {
      DenseCoeffsBase<Eigen::SelfCwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,Eigen::Block<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,-1,-1,false>,-1,-1,false>,Eigen::CoeffBasedProduct<Eigen::Matrix<double,-1,1,0,2,1>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>const,-1,1,false>const>const,256>>,1>
      ::
      copyCoeffByOuterInner<Eigen::CoeffBasedProduct<Eigen::Matrix<double,_1,1,0,2,1>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>const,_1,1,false>const>const,256>>
                (in_RSI,outer_00,inner_00,other);
    }
  }
  return;
}

Assistant:

static inline void run(Derived1 &dst, const Derived2 &src)
  {
    const Index innerSize = dst.innerSize();
    const Index outerSize = dst.outerSize();
    for(Index outer = 0; outer < outerSize; ++outer)
      for(Index inner = 0; inner < innerSize; ++inner)
        dst.copyCoeffByOuterInner(outer, inner, src);
  }